

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O2

void anon_unknown.dwarf_3813e::generateRandomTileFile
               (string *filename,int channelCount,Compression compression)

{
  PixelType PVar1;
  PixelType PVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ostream *poVar12;
  string *psVar13;
  void *pvVar14;
  int k;
  uint uVar15;
  int j;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int i;
  long lVar19;
  long lVar20;
  uint l;
  long lVar21;
  ulong uVar22;
  float f;
  long local_318;
  int local_304;
  Array<Imf_3_4::Array2D<void_*>_> data;
  DeepTiledOutputFile file;
  anon_class_8_1_26b32173 generate_random_int;
  Array2D<unsigned_int> sampleCount;
  int type;
  Box2i box;
  default_random_engine generator;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  ostream local_1a8 [376];
  
  poVar12 = std::operator<<((ostream *)&std::cout,"  generating deep tiled file \'");
  poVar12 = std::operator<<(poVar12,(string *)filename);
  poVar12 = std::operator<<(poVar12,"\' compression ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,compression);
  std::endl<char,std::char_traits<char>>(poVar12);
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_4::Header::Header
            ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
             (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y,
             compression);
  Imf_3_4::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_3_4::Header::~Header((Header *)&ss);
  generate_random_int.generator = &generator;
  generator._M_x = 1;
  if (DAT_00337a18 != (anonymous_namespace)::channelTypes) {
    DAT_00337a18 = (anonymous_namespace)::channelTypes;
  }
  uVar15 = 0;
  uVar5 = 0;
  if (0 < channelCount) {
    uVar5 = channelCount;
  }
  for (; uVar5 != uVar15; uVar15 = uVar15 + 1) {
    type = generateRandomTileFile::anon_class_8_1_26b32173::operator()(&generate_random_int,3);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1a8,uVar15);
    std::__cxx11::stringbuf::str();
    if (type == 0) {
      psVar13 = (string *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&box,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(psVar13,(Channel *)&frameBuffer);
    }
    if (type == 1) {
      psVar13 = (string *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&box,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(psVar13,(Channel *)&frameBuffer);
    }
    if (type == 2) {
      psVar13 = (string *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&box,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(psVar13,(Channel *)&frameBuffer);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::channelTypes,&type);
    std::__cxx11::string::~string((string *)&frameBuffer);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  Imf_3_4::Header::setType((string *)(anonymous_namespace)::header);
  iVar6 = generateRandomTileFile::anon_class_8_1_26b32173::operator()(&generate_random_int,0x111);
  iVar7 = generateRandomTileFile::anon_class_8_1_26b32173::operator()(&generate_random_int,0xa9);
  _ss = iVar6 + 1;
  Imf_3_4::Header::setTileDescription((TileDescription *)(anonymous_namespace)::header);
  remove((filename->_M_dataplus)._M_p);
  Imf_3_4::DeepTiledOutputFile::DeepTiledOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array(&data,(long)channelCount);
  uVar3 = (ulong)uVar5;
  for (lVar19 = 0; uVar3 * 0x18 - lVar19 != 0; lVar19 = lVar19 + 0x18) {
    Imf_3_4::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)((long)&(data._data)->_sizeX + lVar19),0xa9,0x111);
  }
  sampleCount._sizeX = 0;
  sampleCount._sizeY = 0;
  sampleCount._data = (uint *)0x0;
  Imf_3_4::Array2D<unsigned_int>::resizeErase(&sampleCount,0xa9,0x111);
  poVar12 = std::operator<<((ostream *)&std::cout,"   tileSizeX ");
  Imf_3_4::DeepTiledOutputFile::tileXSize();
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,"   tileSizeY ");
  Imf_3_4::DeepTiledOutputFile::tileYSize();
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::endl<char,std::char_traits<char>>(poVar12);
  iVar6 = Imf_3_4::DeepTiledOutputFile::numYLevels();
  iVar8 = Imf_3_4::DeepTiledOutputFile::numXLevels();
  Imf_3_4::Array2D<Imf_3_4::Array2D<unsigned_int>_>::resizeErase
            ((Array2D<Imf_3_4::Array2D<unsigned_int>_> *)&(anonymous_namespace)::sampleCountTiles,
             (long)iVar6,(long)iVar8);
  lVar19 = 0;
  for (lVar20 = 0; lVar20 < (anonymous_namespace)::sampleCountTiles; lVar20 = lVar20 + 1) {
    lVar21 = 0;
    for (lVar16 = 0; lVar16 < DAT_00337a48; lVar16 = lVar16 + 1) {
      Imf_3_4::Array2D<unsigned_int>::resizeErase
                ((Array2D<unsigned_int> *)(DAT_00337a48 * lVar19 + _DAT_00337a50 + lVar21),0xa9,
                 0x111);
      lVar21 = lVar21 + 0x18;
    }
    lVar19 = lVar19 + 0x18;
  }
  lVar20 = (long)DAT_003379f4 * 0x111 + (long)(anonymous_namespace)::dataWindow;
  Imf_3_4::Slice::Slice
            ((Slice *)&ss,UINT,(char *)(sampleCount._data + -lVar20),4,0x444,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  lVar19 = 0x10;
  for (uVar17 = 0; uVar3 != uVar17; uVar17 = uVar17 + 1) {
    PVar1 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar17 * 4);
    PVar2 = (uint)(PVar1 != UINT) * 3;
    if (PVar1 == HALF) {
      PVar2 = PVar1;
    }
    if (PVar1 == FLOAT) {
      PVar2 = PVar1;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1a8,(int)uVar17);
    std::__cxx11::stringbuf::str();
    iVar6 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
    uVar22 = (ulong)(iVar6 == 0) << 2;
    if (iVar6 == 1) {
      uVar22 = 2;
    }
    if (iVar6 == 2) {
      uVar22 = 4;
    }
    Imf_3_4::DeepSlice::DeepSlice
              ((DeepSlice *)&box,PVar2,
               (char *)(*(long *)((long)&(data._data)->_sizeX + lVar19) + lVar20 * -8),8,0x888,
               uVar22,1,1,0.0,false,false);
    Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    lVar19 = lVar19 + 0x18;
  }
  Imf_3_4::DeepTiledOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  local_318 = 0;
  do {
    iVar6 = Imf_3_4::DeepTiledOutputFile::numYLevels();
    if (iVar6 <= local_318) {
      poVar12 = std::operator<<((ostream *)&std::cout,"   --> done");
      std::endl<char,std::char_traits<char>>(poVar12);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&sampleCount);
      Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array(&data);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_4::DeepTiledOutputFile::~DeepTiledOutputFile(&file);
      return;
    }
    lVar19 = 0;
    while( true ) {
      iVar6 = Imf_3_4::DeepTiledOutputFile::numXLevels();
      if (iVar6 <= lVar19) break;
      Imf_3_4::DeepTiledOutputFile::dataWindowForLevel((int)&ss,(int)&file);
      local_304 = 0;
      while( true ) {
        iVar8 = (int)&file;
        iVar6 = Imf_3_4::DeepTiledOutputFile::numYTiles(iVar8);
        if (iVar6 <= local_304) break;
        iVar6 = 0;
        while( true ) {
          iVar8 = Imf_3_4::DeepTiledOutputFile::numXTiles((int)&file);
          if (iVar8 <= iVar6) break;
          Imf_3_4::DeepTiledOutputFile::dataWindowForTile((int)&box,(int)&file,iVar6,local_304);
          for (iVar8 = box.min.y; iVar8 <= box.max.y; iVar8 = iVar8 + 1) {
            for (iVar11 = box.min.x; iVar11 <= box.max.x; iVar11 = iVar11 + 1) {
              lVar21 = (long)_ss;
              iVar9 = generateRandomTileFile::anon_class_8_1_26b32173::operator()
                                (&generate_random_int,10);
              lVar21 = iVar11 - lVar21;
              lVar16 = (long)iVar8 - (long)(iVar7 + 1);
              sampleCount._data[sampleCount._sizeY * lVar16 + lVar21] = iVar9 + 1U;
              lVar20 = DAT_00337a48 * local_318 * 0x18 + _DAT_00337a50;
              *(uint *)(*(long *)(lVar19 * 0x18 + 8 + lVar20) * lVar16 * 4 +
                        *(long *)(lVar19 * 0x18 + 0x10 + lVar20) + lVar21 * 4) = iVar9 + 1U;
              iVar9 = ((int)lVar16 * 0x111 + (int)lVar21) % 0x801;
              f = (float)iVar9;
              lVar20 = sampleCount._sizeY;
              for (uVar17 = 0; uVar17 != uVar3; uVar17 = uVar17 + 1) {
                iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
                if (iVar10 == 0) {
                  pvVar14 = operator_new__((ulong)sampleCount._data[lVar20 * lVar16 + lVar21] << 2);
                  data._data[uVar17]._data[data._data[uVar17]._sizeY * lVar16 + lVar21] = pvVar14;
                  iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
                }
                if (iVar10 == 1) {
                  pvVar14 = operator_new__((ulong)sampleCount._data[lVar20 * lVar16 + lVar21] * 2);
                  data._data[uVar17]._data[data._data[uVar17]._sizeY * lVar16 + lVar21] = pvVar14;
                  iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
                }
                if (iVar10 == 2) {
                  pvVar14 = operator_new__((ulong)sampleCount._data[lVar20 * lVar16 + lVar21] << 2);
                  data._data[uVar17]._data[data._data[uVar17]._sizeY * lVar16 + lVar21] = pvVar14;
                }
                lVar18 = 0;
                for (uVar22 = 0; lVar4 = (anonymous_namespace)::channelTypes,
                    uVar22 < sampleCount._data[lVar20 * lVar16 + lVar21]; uVar22 = uVar22 + 1) {
                  iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
                  if (iVar10 == 0) {
                    *(int *)((long)data._data[uVar17]._data
                                   [data._data[uVar17]._sizeY * lVar16 + lVar21] + lVar18 * 2) =
                         iVar9;
                    iVar10 = *(int *)(lVar4 + uVar17 * 4);
                  }
                  if (iVar10 == 1) {
                    Imath_3_2::half::operator=
                              ((half *)((long)data._data[uVar17]._data
                                              [data._data[uVar17]._sizeY * lVar16 + lVar21] + lVar18
                                       ),f);
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
                  }
                  if (iVar10 == 2) {
                    *(float *)((long)data._data[uVar17]._data
                                     [data._data[uVar17]._sizeY * lVar16 + lVar21] + lVar18 * 2) = f
                    ;
                  }
                  lVar18 = lVar18 + 2;
                  lVar20 = sampleCount._sizeY;
                }
              }
            }
          }
          iVar6 = iVar6 + 1;
        }
        local_304 = local_304 + 1;
      }
      iVar6 = Imf_3_4::DeepTiledOutputFile::numXTiles(iVar8);
      iVar11 = Imf_3_4::DeepTiledOutputFile::numYTiles(iVar8);
      Imf_3_4::DeepTiledOutputFile::writeTiles(iVar8,0,iVar6 + -1,0,iVar11 + -1,(int)lVar19);
      lVar20 = 0;
      while( true ) {
        iVar6 = Imf_3_4::DeepTiledOutputFile::levelHeight(iVar8);
        if (iVar6 <= lVar20) break;
        lVar16 = 0;
        while( true ) {
          iVar6 = Imf_3_4::DeepTiledOutputFile::levelWidth(iVar8);
          if (iVar6 <= lVar16) break;
          lVar21 = 4;
          for (uVar17 = 0; uVar3 != uVar17; uVar17 = uVar17 + 1) {
            iVar6 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
            if (iVar6 == 0) {
              pvVar14 = *(void **)(*(long *)((long)data._data + lVar21 * 4 + -8) * lVar20 * 8 +
                                   *(long *)((long)&(data._data)->_sizeX + lVar21 * 4) + lVar16 * 8)
              ;
              if (pvVar14 != (void *)0x0) {
                operator_delete__(pvVar14);
                iVar6 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
                goto LAB_001182d2;
              }
            }
            else {
LAB_001182d2:
              if (iVar6 == 1) {
                pvVar14 = *(void **)(*(long *)((long)data._data + lVar21 * 4 + -8) * lVar20 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar21 * 4) +
                                    lVar16 * 8);
                if (pvVar14 == (void *)0x0) goto LAB_0011832f;
                operator_delete__(pvVar14);
                iVar6 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
              }
              if ((iVar6 == 2) &&
                 (pvVar14 = *(void **)(*(long *)((long)data._data + lVar21 * 4 + -8) * lVar20 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar21 * 4) +
                                      lVar16 * 8), pvVar14 != (void *)0x0)) {
                operator_delete__(pvVar14);
              }
            }
LAB_0011832f:
            lVar21 = lVar21 + 6;
          }
          lVar16 = lVar16 + 1;
        }
        lVar20 = lVar20 + 1;
      }
      lVar19 = lVar19 + 1;
    }
    local_318 = local_318 + 1;
  } while( true );
}

Assistant:

void
generateRandomTileFile (
    const std::string& filename, int channelCount, Compression compression)
{
    std::cout << "  generating deep tiled file '" << filename
              << "' compression " << compression << std::endl;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);

    constexpr bool             relativeCoords = false;
    std::default_random_engine generator;
    auto                       generate_random_int = [&] (int range) -> int {
        std::uniform_int_distribution<int> distribution (0, range - 1);
        return distribution (generator);
    };
    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int               type = generate_random_int (3);
        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPTILE);
    header.setTileDescription (TileDescription (
        generate_random_int (width) + 1,
        generate_random_int (height) + 1,
        RIPMAP_LEVELS));

    //
    // Set up the output file
    //
    remove (filename.c_str ());
    DeepTiledOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    Array2D<unsigned int> sampleCount;
    sampleCount.resizeErase (height, width);

    std::cout << "   tileSizeX " << file.tileXSize () << "   tileSizeY "
              << file.tileYSize () << std::endl;

    sampleCountTiles.resizeErase (file.numYLevels (), file.numXLevels ());
    for (int i = 0; i < sampleCountTiles.height (); i++)
        for (int j = 0; j < sampleCountTiles.width (); j++)
            sampleCountTiles[i][j].resizeErase (height, width);

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&sampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            for (int j = 0; j < file.numYTiles (ly); j++)
            {
                for (int i = 0; i < file.numXTiles (lx); i++)
                {
                    Box2i box = file.dataWindowForTile (i, j, lx, ly);
                    for (int y = box.min.y; y <= box.max.y; y++)
                        for (int x = box.min.x; x <= box.max.x; x++)
                        {
                            int dwy = y - dataWindowL.min.y;
                            int dwx = x - dataWindowL.min.x;
                            sampleCount[dwy][dwx] =
                                generate_random_int (10) + 1;
                            sampleCountTiles[ly][lx][dwy][dwx] =
                                sampleCount[dwy][dwx];
                            for (int k = 0; k < channelCount; k++)
                            {
                                if (channelTypes[k] == 0)
                                    data[k][dwy][dwx] =
                                        new unsigned int[sampleCount[dwy][dwx]];
                                if (channelTypes[k] == 1)
                                    data[k][dwy][dwx] =
                                        new half[sampleCount[dwy][dwx]];
                                if (channelTypes[k] == 2)
                                    data[k][dwy][dwx] =
                                        new float[sampleCount[dwy][dwx]];
                                for (unsigned int l = 0;
                                     l < sampleCount[dwy][dwx];
                                     l++)
                                {
                                    if (channelTypes[k] == 0)
                                        ((unsigned int*) data[k][dwy][dwx])[l] =
                                            (dwy * width + dwx) % 2049;
                                    if (channelTypes[k] == 1)
                                        ((half*) data[k][dwy][dwx])[l] =
                                            (dwy * width + dwx) % 2049;
                                    if (channelTypes[k] == 2)
                                        ((float*) data[k][dwy][dwx])[l] =
                                            (dwy * width + dwx) % 2049;
                                }
                            }
                        }
                }
            }

            file.writeTiles (
                0, file.numXTiles (lx) - 1, 0, file.numYTiles (ly) - 1, lx, ly);

            for (int i = 0; i < file.levelHeight (ly); i++)
                for (int j = 0; j < file.levelWidth (lx); j++)
                    for (int k = 0; k < channelCount; k++)
                    {
                        if (channelTypes[k] == 0)
                            delete[] (unsigned int*) data[k][i][j];
                        if (channelTypes[k] == 1)
                            delete[] (half*) data[k][i][j];
                        if (channelTypes[k] == 2)
                            delete[] (float*) data[k][i][j];
                    }
        }
    std::cout << "   --> done" << std::endl;
}